

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_inflate.c
# Opt level: O3

REF_STATUS ref_inflate_compact_rail(REF_INT *n,REF_DBL *x,REF_DBL *yz,REF_DBL *phi)

{
  uint uVar1;
  REF_DBL RVar2;
  REF_INT RVar3;
  REF_DBL *pRVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  
  uVar1 = *n;
  if ((ulong)uVar1 != 0) {
    RVar3 = 1;
    if (1 < (int)uVar1) {
      pRVar4 = yz + 2;
      uVar7 = 0;
      uVar5 = 1;
      do {
        uVar6 = (uint)(1e-08 < x[uVar5] - x[uVar7]) + (int)uVar7;
        uVar7 = (ulong)uVar6;
        if (uVar5 != uVar7) {
          x[uVar7] = x[uVar5];
          RVar2 = pRVar4[1];
          yz[uVar6 * 2] = *pRVar4;
          (yz + uVar6 * 2)[1] = RVar2;
          phi[uVar7] = phi[uVar5];
        }
        uVar5 = uVar5 + 1;
        pRVar4 = pRVar4 + 2;
      } while (uVar1 != uVar5);
      RVar3 = uVar6 + 1;
    }
    *n = RVar3;
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_inflate_compact_rail(REF_INT *n, REF_DBL *x, REF_DBL *yz,
                                            REF_DBL *phi) {
  REF_INT orig, compact, max;
  REF_DBL tol = 1e-8;
  if (0 == *n) return REF_SUCCESS;

  max = *n;
  compact = 0;

  for (orig = 1; orig < max; orig++) {
    if (ABS(x[orig] - x[compact] > tol)) {
      compact++;
    }
    if (orig != compact) {
      x[compact] = x[orig];
      yz[0 + 2 * compact] = yz[0 + 2 * orig];
      yz[1 + 2 * compact] = yz[1 + 2 * orig];
      phi[compact] = phi[orig];
    }
  }
  *n = compact + 1;

  return REF_SUCCESS;
}